

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O3

void duckdb::ValidityFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  BufferManager *pBVar6;
  unsigned_long uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  BufferHandle handle;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  BufferHandle local_48;
  idx_t local_30;
  
  pBVar6 = BufferManager::GetBufferManager(segment->db);
  (*pBVar6->_vptr_BufferManager[7])(&local_48,pBVar6,&segment->block);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.node);
  pdVar1 = (local_48.node.ptr)->buffer;
  iVar2 = segment->offset;
  FlatVector::VerifyFlatVector(result);
  uVar7 = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  if ((*(ulong *)(pdVar1 + (uVar7 >> 6) * 8 + iVar2) >> (uVar7 & 0x3f) & 1) == 0) {
    _Var9._M_head_impl = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    if (_Var9._M_head_impl == (unsigned_long *)0x0) {
      local_30 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,&local_30);
      p_Var5 = p_Stack_50;
      peVar4 = local_58;
      local_58 = (element_type *)0x0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
        }
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data);
      _Var9._M_head_impl =
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           _Var9._M_head_impl;
    }
    bVar3 = (byte)result_idx & 0x3f;
    _Var9._M_head_impl[result_idx >> 6] =
         _Var9._M_head_impl[result_idx >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
  }
  BufferHandle::~BufferHandle(&local_48);
  return;
}

Assistant:

void ValidityFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	D_ASSERT(row_id >= 0 && row_id < row_t(segment.count));
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	auto dataptr = handle.Ptr() + segment.GetBlockOffset();
	ValidityMask mask(reinterpret_cast<validity_t *>(dataptr), segment.count);
	auto &result_mask = FlatVector::Validity(result);
	if (!mask.RowIsValidUnsafe(NumericCast<idx_t>(row_id))) {
		result_mask.SetInvalid(result_idx);
	}
}